

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# succinct_bitvector.h
# Opt level: O0

void __thiscall
bwtil::succinct_bitvector::succinct_bitvector
          (succinct_bitvector *this,vector<bool,_std::allocator<bool>_> *vb)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *in_RDI;
  reference rVar3;
  ulint i;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  succinct_bitvector *in_stack_ffffffffffffff90;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  reference local_28;
  ulong local_18;
  
  *in_RDI = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1622bd);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1622d0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1622e3);
  in_RDI[10] = 0;
  *(undefined2 *)(in_RDI + 0xb) = 0;
  *in_RDI = 0;
  in_RDI[10] = 0;
  *(undefined2 *)(in_RDI + 0xb) = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffd0);
    if (sVar2 <= uVar1) break;
    rVar3 = std::vector<bool,_std::allocator<bool>_>::at
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff90,
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff90 = (succinct_bitvector *)rVar3._M_mask;
    local_28 = rVar3;
    std::_Bit_reference::operator_cast_to_bool(&local_28);
    push_back(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

succinct_bitvector(vector<bool> &vb){

		n=0;
		global_rank1=0;
		local_rank1=0;

		for(ulint i=0;i<vb.size();i++)
			push_back(vb.at(i));

	}